

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

int StoreImageToBitMask(VP8LBitWriter *bw,int width,int histo_bits,VP8LBackwardRefs *refs,
                       uint32_t *histogram_symbols,HuffmanTreeCode *huffman_codes,WebPPicture *pic)

{
  byte bVar1;
  VP8LBitWriter *bw_00;
  PixOrCopy *pPVar2;
  int iVar3;
  uint uVar4;
  PixOrCopy *v;
  int k;
  long lVar5;
  uint uVar6;
  HuffmanTreeCode *pHVar7;
  int code;
  int n_bits;
  int bits;
  uint local_84;
  HuffmanTreeCode *local_80;
  VP8LBitWriter *local_78;
  uint local_70;
  int local_6c;
  uint32_t local_68;
  uint local_64;
  ulong local_60;
  uint32_t *local_58;
  HuffmanTreeCode *local_50;
  VP8LRefsCursor c;
  
  bVar1 = (byte)histo_bits;
  local_64 = -1 << (bVar1 & 0x1f);
  local_70 = ((1 << (bVar1 & 0x1f)) + width) - 1U >> (bVar1 & 0x1f);
  if (histo_bits == 0) {
    local_64 = 0;
    local_70 = 1;
  }
  local_80 = huffman_codes + (ulong)*(ushort *)((long)histogram_symbols + 1) * 5;
  local_78 = bw;
  local_6c = histo_bits;
  local_58 = histogram_symbols;
  local_50 = huffman_codes;
  VP8LRefsCursorInit(&c,refs);
  local_60 = 0;
  local_84 = 0;
  uVar6 = 0;
  uVar4 = 0;
  while (pPVar2 = c.cur_pos, c.cur_pos != (PixOrCopy *)0x0) {
    if ((local_84 != (uVar4 & local_64)) || ((uint)local_60 != (uVar6 & local_64))) {
      local_80 = local_50 +
                 (ulong)*(ushort *)
                         ((long)local_58 +
                         (long)(int)(((int)uVar4 >> ((byte)local_6c & 0x1f)) +
                                    ((int)uVar6 >> ((byte)local_6c & 0x1f)) * local_70) * 4 + 1) * 5
      ;
      local_60 = (ulong)(uVar6 & local_64);
      local_84 = uVar4 & local_64;
    }
    if ((c.cur_pos)->mode == '\x01') {
      WriteHuffmanCode(local_78,local_80,(c.cur_pos)->argb_or_distance + 0x118);
    }
    else if ((c.cur_pos)->mode == '\0') {
      pHVar7 = local_80;
      for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
        WriteHuffmanCode(local_78,pHVar7,
                         pPVar2->argb_or_distance >> (("\x01\x02"[lVar5] & 3) << 3) & 0xff);
        pHVar7 = pHVar7 + 1;
      }
    }
    else {
      local_68 = (c.cur_pos)->argb_or_distance;
      VP8LPrefixEncode((uint)(c.cur_pos)->len,&code,&n_bits,&bits);
      bw_00 = local_78;
      pHVar7 = local_80;
      VP8LPutBits(local_78,bits << (local_80->code_lengths[(long)code + 0x100] & 0x1f) |
                           (uint)local_80->codes[(long)code + 0x100],
                  (uint)local_80->code_lengths[(long)code + 0x100] + n_bits);
      VP8LPrefixEncode(local_68,&code,&n_bits,&bits);
      WriteHuffmanCode(bw_00,pHVar7 + 4,code);
      VP8LPutBits(bw_00,bits,n_bits);
    }
    uVar4 = uVar4 + pPVar2->len;
    while (width <= (int)uVar4) {
      uVar6 = uVar6 + 1;
      uVar4 = uVar4 - width;
    }
    c.cur_pos = c.cur_pos + 1;
    if (c.cur_pos == c.last_pos_) {
      VP8LRefsCursorNextBlock(&c);
    }
  }
  iVar3 = 1;
  if (local_78->error_ != 0) {
    iVar3 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return iVar3;
}

Assistant:

static int StoreImageToBitMask(VP8LBitWriter* const bw, int width,
                               int histo_bits,
                               const VP8LBackwardRefs* const refs,
                               const uint32_t* histogram_symbols,
                               const HuffmanTreeCode* const huffman_codes,
                               const WebPPicture* const pic) {
  const int histo_xsize = histo_bits ? VP8LSubSampleSize(width, histo_bits) : 1;
  const int tile_mask = (histo_bits == 0) ? 0 : -(1 << histo_bits);
  // x and y trace the position in the image.
  int x = 0;
  int y = 0;
  int tile_x = x & tile_mask;
  int tile_y = y & tile_mask;
  int histogram_ix = (histogram_symbols[0] >> 8) & 0xffff;
  const HuffmanTreeCode* codes = huffman_codes + 5 * histogram_ix;
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if ((tile_x != (x & tile_mask)) || (tile_y != (y & tile_mask))) {
      tile_x = x & tile_mask;
      tile_y = y & tile_mask;
      histogram_ix = (histogram_symbols[(y >> histo_bits) * histo_xsize +
                                        (x >> histo_bits)] >>
                      8) &
                     0xffff;
      codes = huffman_codes + 5 * histogram_ix;
    }
    if (PixOrCopyIsLiteral(v)) {
      static const uint8_t order[] = { 1, 2, 0, 3 };
      int k;
      for (k = 0; k < 4; ++k) {
        const int code = PixOrCopyLiteral(v, order[k]);
        WriteHuffmanCode(bw, codes + k, code);
      }
    } else if (PixOrCopyIsCacheIdx(v)) {
      const int code = PixOrCopyCacheIdx(v);
      const int literal_ix = 256 + NUM_LENGTH_CODES + code;
      WriteHuffmanCode(bw, codes, literal_ix);
    } else {
      int bits, n_bits;
      int code;

      const int distance = PixOrCopyDistance(v);
      VP8LPrefixEncode(v->len, &code, &n_bits, &bits);
      WriteHuffmanCodeWithExtraBits(bw, codes, 256 + code, bits, n_bits);

      // Don't write the distance with the extra bits code since
      // the distance can be up to 18 bits of extra bits, and the prefix
      // 15 bits, totaling to 33, and our PutBits only supports up to 32 bits.
      VP8LPrefixEncode(distance, &code, &n_bits, &bits);
      WriteHuffmanCode(bw, codes + 4, code);
      VP8LPutBits(bw, bits, n_bits);
    }
    x += PixOrCopyLength(v);
    while (x >= width) {
      x -= width;
      ++y;
    }
    VP8LRefsCursorNext(&c);
  }
  if (bw->error_) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return 1;
}